

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O3

BVIndex __thiscall BVFixed::GetNextBit(BVFixed *this,BVIndex i)

{
  BVFixed BVar1;
  long lVar2;
  BVIndex BVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint index;
  BVFixed *pBVar7;
  
  AssertRange(this,i);
  AssertRange(this,i);
  uVar4 = i >> 6;
  index = i & 0x3f;
  BVUnitT<unsigned_long>::AssertRange(index);
  BVar1 = this[(ulong)uVar4 + 1];
  BVUnitT<unsigned_long>::AssertRange(index);
  uVar6 = ((ulong)BVar1 >> (sbyte)index) << (sbyte)index;
  if (uVar6 == 0) {
    pBVar7 = this + (ulong)uVar4 + 2;
    iVar5 = uVar4 * -0x40;
    do {
      BVar3 = WordCount(this->len);
      if (pBVar7 == this + (ulong)BVar3 + 1) {
        return 0xffffffff;
      }
      BVar1 = *pBVar7;
      pBVar7 = pBVar7 + 1;
      iVar5 = iVar5 + -0x40;
    } while (BVar1 == (BVFixed)0x0);
    lVar2 = 0;
    if (BVar1 != (BVFixed)0x0) {
      for (; ((ulong)BVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar4 = (int)lVar2 - iVar5;
  }
  else {
    lVar2 = 0;
    if (uVar6 != 0) {
      for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar4 = (uint)lVar2 | i & 0xffffffc0;
  }
  return uVar4;
}

Assistant:

BVIndex
BVFixed::GetNextBit(BVIndex i) const
{
    AssertRange(i);

    const   BVUnit * chunk      = BitsFromIndex(i);
            BVIndex  base       = BVUnit::Floor(i);


    BVIndex offset = chunk->GetNextBit(BVUnit::Offset(i));
    if(-1 != offset)
    {
        return base + offset;
    }

    while(++chunk != this->EndUnit())
    {
        base  += BVUnit::BitsPerWord;
        offset = chunk->GetNextBit();
        if(-1 != offset)
        {
            return base + offset;
        }
    }

   return BVInvalidIndex;
}